

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::LoadBoard(BoardView *this,BRDFileBase *file)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  int iVar4;
  BRDBoard *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  shared_ptr<Point> *pa;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  shared_ptr<Net> *n;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partnames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  netnames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  _Vector_base<BRDPin,_std::allocator<BRDPin>_> local_b8;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint local_88;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> local_78;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_60;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_48;
  
  if (this->m_board != (Board *)0x0) {
    (*this->m_board->_vptr_Board[1])();
  }
  if (((ulong)((long)(file->outline_segments).
                     super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x21) &&
     ((ulong)((long)(file->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(file->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x11)) {
    local_98 = &file->format;
    std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
              ((vector<BRDPin,_std::allocator<BRDPin>_> *)&local_b8,&file->pins);
    iVar6 = 0x7fffffff;
    iVar8 = -0x80000000;
    iVar4 = -0x80000000;
    iVar7 = 0x7fffffff;
    for (; local_b8._M_impl.super__Vector_impl_data._M_start !=
           local_b8._M_impl.super__Vector_impl_data._M_finish;
        local_b8._M_impl.super__Vector_impl_data._M_start =
             local_b8._M_impl.super__Vector_impl_data._M_start + 1) {
      iVar1 = ((local_b8._M_impl.super__Vector_impl_data._M_start)->pos).x;
      if (iVar4 < iVar1) {
        iVar4 = iVar1;
      }
      iVar2 = ((local_b8._M_impl.super__Vector_impl_data._M_start)->pos).y;
      if (iVar8 < iVar2) {
        iVar8 = iVar2;
      }
      if (iVar1 < iVar7) {
        iVar7 = iVar1;
      }
      if (iVar2 < iVar6) {
        iVar6 = iVar2;
      }
    }
    iVar7 = iVar7 + -200;
    iVar6 = iVar6 + -200;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar6,iVar7);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (local_98,(BRDPoint *)&local_d8);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar6,iVar4 + 200);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (local_98,(BRDPoint *)&local_d8);
    this_00 = local_98;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar8 + 200,iVar4 + 200);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (local_98,(BRDPoint *)&local_d8);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar8 + 200,iVar7);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_d8);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar6,iVar7);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_d8);
    std::_Vector_base<BRDPin,_std::allocator<BRDPin>_>::~_Vector_base(&local_b8);
  }
  this_01 = (BRDBoard *)operator_new(0x88);
  BRDBoard::BRDBoard(this_01,file);
  this->m_board = (Board *)this_01;
  iVar4 = (*(this_01->super_Board)._vptr_Board[3])(this_01);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
            (&local_48,
             (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             CONCAT44(extraout_var,iVar4));
  Searcher::setParts(&this->searcher,&local_48);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&local_48);
  iVar4 = (*this->m_board->_vptr_Board[2])();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
            (&local_60,
             (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             CONCAT44(extraout_var_00,iVar4));
  Searcher::setNets(&this->searcher,&local_60);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&local_60);
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = (*this->m_board->_vptr_Board[2])();
  plVar3 = (long *)((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1];
  for (plVar9 = *(long **)CONCAT44(extraout_var_01,iVar4); plVar9 != plVar3; plVar9 = plVar9 + 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8,(value_type *)(*plVar9 + 0x10));
  }
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = (*this->m_board->_vptr_Board[3])();
  plVar3 = (long *)((undefined8 *)CONCAT44(extraout_var_02,iVar4))[1];
  for (plVar9 = *(long **)CONCAT44(extraout_var_02,iVar4); plVar9 != plVar3; plVar9 = plVar9 + 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8,(value_type *)(*plVar9 + 0x18));
  }
  SpellCorrector::setDictionary
            (&this->scnets,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b8);
  SpellCorrector::setDictionary(&this->scparts,&local_d8);
  iVar4 = (*this->m_board->_vptr_Board[2])();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::operator=
            (&this->m_nets,
             (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             CONCAT44(extraout_var_03,iVar4));
  iVar4 = (*this->m_board->_vptr_Board[5])();
  local_98._0_4_ = 0x80000000;
  local_98._4_4_ = 0x80000000;
  local_88 = 0x7fffffff;
  uStack_84 = 0x7fffffff;
  for (puVar5 = *(undefined8 **)CONCAT44(extraout_var_04,iVar4); uStack_8c = 0, uStack_90 = 0,
      uStack_7c = 0, uStack_80 = 0,
      puVar5 != (undefined8 *)((undefined8 *)CONCAT44(extraout_var_04,iVar4))[1];
      puVar5 = puVar5 + 2) {
    fVar18 = (float)*(undefined8 *)*puVar5;
    fVar22 = (float)((ulong)*(undefined8 *)*puVar5 >> 0x20);
    local_88 = ~-(uint)(fVar18 < (float)(int)local_88) & local_88 |
               (int)fVar18 & -(uint)(fVar18 < (float)(int)local_88);
    uStack_84 = ~-(uint)(fVar22 < (float)(int)uStack_84) & uStack_84 |
                (int)fVar22 & -(uint)(fVar22 < (float)(int)uStack_84);
    local_98._0_4_ =
         ~-(uint)((float)(int)(uint)local_98 < fVar18) & (uint)local_98 |
         (int)fVar18 & -(uint)((float)(int)(uint)local_98 < fVar18);
    local_98._4_4_ =
         ~-(uint)((float)(int)local_98._4_4_ < fVar22) & local_98._4_4_ |
         (int)fVar22 & -(uint)((float)(int)local_98._4_4_ < fVar22);
  }
  iVar4 = (*this->m_board->_vptr_Board[6])();
  uVar11 = local_88;
  uVar14 = uStack_84;
  uVar10 = (uint)local_98;
  uVar13 = local_98._4_4_;
  for (puVar5 = *(undefined8 **)CONCAT44(extraout_var_05,iVar4);
      puVar5 != (undefined8 *)((undefined8 *)CONCAT44(extraout_var_05,iVar4))[1];
      puVar5 = puVar5 + 2) {
    fVar18 = (float)*puVar5;
    fVar22 = (float)((ulong)*puVar5 >> 0x20);
    uVar19 = ~-(uint)(fVar18 < (float)(int)uVar11) & uVar11 |
             (int)fVar18 & -(uint)(fVar18 < (float)(int)uVar11);
    uVar21 = ~-(uint)(fVar22 < (float)(int)uVar14) & uVar14 |
             (int)fVar22 & -(uint)(fVar22 < (float)(int)uVar14);
    fVar15 = (float)puVar5[1];
    fVar17 = (float)((ulong)puVar5[1] >> 0x20);
    uVar12 = ~-(uint)((float)(int)uVar10 < fVar18) & uVar10 |
             (int)fVar18 & -(uint)((float)(int)uVar10 < fVar18);
    uVar16 = ~-(uint)((float)(int)uVar13 < fVar22) & uVar13 |
             (int)fVar22 & -(uint)((float)(int)uVar13 < fVar22);
    uVar10 = -(uint)((float)(int)uVar12 < fVar15);
    uVar13 = -(uint)((float)(int)uVar16 < fVar17);
    uVar11 = -(uint)(fVar15 < (float)(int)uVar19);
    uVar14 = -(uint)(fVar17 < (float)(int)uVar21);
    uVar11 = ~uVar11 & uVar19 | (int)fVar15 & uVar11;
    uVar14 = ~uVar14 & uVar21 | (int)fVar17 & uVar14;
    uVar10 = ~uVar10 & uVar12 | (int)fVar15 & uVar10;
    uVar13 = ~uVar13 & uVar16 | (int)fVar17 & uVar13;
  }
  fVar18 = (this->m_board_surface).x;
  fVar15 = (float)(int)(uVar11 + uVar10) * 0.5;
  fVar17 = (float)(int)(uVar14 + uVar13) * 0.5;
  fVar22 = (this->m_board_surface).y;
  this->m_mx = fVar15;
  this->m_my = fVar17;
  fVar20 = (float)(int)(uVar10 - uVar11) * 1.1;
  fVar23 = (float)(int)(uVar13 - uVar14) * 1.1;
  uVar12 = -(uint)(0.0 < fVar20);
  fVar18 = (float)(~uVar12 & 0x3f800000 | (uint)(fVar18 / fVar20) & uVar12);
  uVar12 = -(uint)(0.0 < fVar23);
  fVar22 = (float)(~uVar12 & 0x3f800000 | (uint)(fVar22 / fVar23) & uVar12);
  if (fVar22 <= fVar18) {
    fVar18 = fVar22;
  }
  this->m_scale = fVar18;
  this->m_scale_floor = fVar18;
  this->m_boardWidth = uVar10 - uVar11;
  this->m_boardHeight = uVar13 - uVar14;
  SetTarget(this,fVar15,fVar17);
  iVar4 = (*this->m_board->_vptr_Board[3])();
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::reserve
            (&this->m_pinHighlighted,
             ((long *)CONCAT44(extraout_var_06,iVar4))[1] - *(long *)CONCAT44(extraout_var_06,iVar4)
             >> 4);
  iVar4 = (*this->m_board->_vptr_Board[3])();
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::reserve
            (&this->m_partHighlighted,
             ((long *)CONCAT44(extraout_var_07,iVar4))[1] - *(long *)CONCAT44(extraout_var_07,iVar4)
             >> 4);
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  this->m_firstFrame = true;
  this->m_needsRedraw = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  return;
}

Assistant:

void BoardView::LoadBoard(BRDFileBase *file) {
	delete m_board;

	// Check board outline (format) point count.
	//		If we don't have an outline, generate one
	//
	if (file->outline_segments.size() < 3 && file->format.size() < 3) {
		auto pins = file->pins;
		int minx, maxx, miny, maxy;
		int margin = 200; // #define or leave this be? Rather arbritary.

		minx = miny = INT_MAX;
		maxx = maxy = INT_MIN;

		for (auto a : pins) {
			if (a.pos.x > maxx) maxx = a.pos.x;
			if (a.pos.y > maxy) maxy = a.pos.y;
			if (a.pos.x < minx) minx = a.pos.x;
			if (a.pos.y < miny) miny = a.pos.y;
		}

		maxx += margin;
		maxy += margin;
		minx -= margin;
		miny -= margin;

		file->format.push_back({minx, miny});
		file->format.push_back({maxx, miny});
		file->format.push_back({maxx, maxy});
		file->format.push_back({minx, maxy});
		file->format.push_back({minx, miny});
	}

	m_board = new BRDBoard(file);
	searcher.setParts(m_board->Components());
	searcher.setNets(m_board->Nets());

	std::vector<std::string> netnames;
	for (auto &n : m_board->Nets()) netnames.push_back(n->name);
	std::vector<std::string> partnames;
	for (auto &p : m_board->Components()) netnames.push_back(p->name);

	scnets.setDictionary(netnames);
	scparts.setDictionary(partnames);

	m_nets = m_board->Nets();

	int min_x = INT_MAX, max_x = INT_MIN, min_y = INT_MAX, max_y = INT_MIN;
	for (auto &pa : m_board->OutlinePoints()) {
		if (pa->x < min_x) min_x = pa->x;
		if (pa->y < min_y) min_y = pa->y;
		if (pa->x > max_x) max_x = pa->x;
		if (pa->y > max_y) max_y = pa->y;
	}
	for (auto &s: m_board->OutlineSegments()) {
		if (s.first.x < min_x) min_x = s.first.x;
		if (s.second.x < min_x) min_x = s.second.x;
		if (s.first.y < min_y) min_y = s.first.y;
		if (s.second.y < min_y) min_y = s.second.y;
		if (s.first.x > max_x) max_x = s.first.x;
		if (s.second.x > max_x) max_x = s.second.x;
		if (s.first.y > max_y) max_y = s.first.y;
		if (s.second.y > max_y) max_y = s.second.y;
	}

	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	m_mx = (float)(min_x + max_x) / 2.0f;
	m_my = (float)(min_y + max_y) / 2.0f;

	float dx = 1.1f * (max_x - min_x);
	float dy = 1.1f * (max_y - min_y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	m_scale_floor = m_scale = sx < sy ? sx : sy;
	m_boardWidth            = max_x - min_x;
	m_boardHeight           = max_y - min_y;
	SetTarget(m_mx, m_my);

	m_pinHighlighted.reserve(m_board->Components().size());
	m_partHighlighted.reserve(m_board->Components().size());
	m_pinSelected = nullptr;

	m_firstFrame  = true;
	m_needsRedraw = true;
}